

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManComputeSlacks(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_01;
  int *piVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX_01;
  int iVar5;
  long lVar6;
  int iVar7;
  
  iVar1 = Gia_ManLevelNum(p);
  __ptr = Gia_ManReverseLevel(p);
  iVar7 = p->nObjs;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar2 = iVar7;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar2;
  iVar5 = 0;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
    uVar4 = extraout_RDX;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
    uVar4 = extraout_RDX_00;
  }
  p_01->pArray = piVar3;
  if (0 < iVar7) {
    if (p->pObjs != (Gia_Obj_t *)0x0) {
      lVar6 = 1;
      do {
        p_00 = p->vLevels;
        Vec_IntFillExtra(p_00,(int)lVar6,(int)uVar4);
        if (((long)p_00->nSize <= lVar6 + -1) || ((long)__ptr->nSize <= lVar6 + -1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p_01,iVar1 - (p_00->pArray[lVar6 + -1] + __ptr->pArray[lVar6 + -1]));
        iVar7 = p->nObjs;
      } while ((lVar6 < iVar7) &&
              (lVar6 = lVar6 + 1, uVar4 = extraout_RDX_01, p->pObjs != (Gia_Obj_t *)0x0));
    }
    iVar5 = p_01->nSize;
  }
  if (iVar5 == iVar7) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    return p_01;
  }
  __assert_fail("Vec_IntSize(vSlacks) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x29f,"Vec_Int_t *Gia_ManComputeSlacks(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManComputeSlacks( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    Vec_Int_t * vLevelR = Gia_ManReverseLevel( p );
    Vec_Int_t * vSlacks = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntPush( vSlacks, nLevels - Gia_ObjLevelId(p, i) - Vec_IntEntry(vLevelR, i) );
    assert( Vec_IntSize(vSlacks) == Gia_ManObjNum(p) );
    Vec_IntFree( vLevelR );
    return vSlacks;
}